

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O3

void __thiscall
TEST_TestRegistry_ResetPluginsWorks_Test::testBody(TEST_TestRegistry_ResetPluginsWorks_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  MyTestPluginDummy plugin2;
  MyTestPluginDummy plugin1;
  SimpleString local_78;
  TestPlugin local_68;
  TestPlugin local_40;
  
  SimpleString::SimpleString((SimpleString *)&local_68,"Plugin-1");
  TestPlugin::TestPlugin(&local_40,(SimpleString *)&local_68);
  local_40._vptr_TestPlugin = (_func_int **)&PTR__TestPlugin_003795d0;
  SimpleString::~SimpleString((SimpleString *)&local_68);
  SimpleString::SimpleString(&local_78,"Plugin-2");
  TestPlugin::TestPlugin(&local_68,&local_78);
  local_68._vptr_TestPlugin = (_func_int **)&PTR__TestPlugin_003795d0;
  SimpleString::~SimpleString(&local_78);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[0xd])(pTVar1,&local_40);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[0xd])(pTVar1,&local_68);
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x12])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,2,(long)iVar2,"LONGS_EQUAL(2, myRegistry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x146,pTVar4);
  (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry[0xe])();
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x12])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar2,"LONGS_EQUAL(0, myRegistry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x148,pTVar4);
  TestPlugin::~TestPlugin(&local_68);
  TestPlugin::~TestPlugin(&local_40);
  return;
}

Assistant:

TEST(TestRegistry, ResetPluginsWorks)
{
    MyTestPluginDummy plugin1("Plugin-1");
    MyTestPluginDummy plugin2("Plugin-2");
    myRegistry->installPlugin(&plugin1);
    myRegistry->installPlugin(&plugin2);
    LONGS_EQUAL(2, myRegistry->countPlugins());
    myRegistry->resetPlugins();
    LONGS_EQUAL(0, myRegistry->countPlugins());
}